

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O0

uint prvTidynodeHeaderLevel(Node *node)

{
  TidyTagId local_20;
  TidyTagId tid;
  Node *node_local;
  
  if ((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) {
    local_20 = TidyTag_UNKNOWN;
  }
  else {
    local_20 = node->tag->id;
  }
  switch(local_20) {
  case TidyTag_H1:
    node_local._4_4_ = 1;
    break;
  case TidyTag_H2:
    node_local._4_4_ = 2;
    break;
  case TidyTag_H3:
    node_local._4_4_ = 3;
    break;
  case TidyTag_H4:
    node_local._4_4_ = 4;
    break;
  case TidyTag_H5:
    node_local._4_4_ = 5;
    break;
  case TidyTag_H6:
    node_local._4_4_ = 6;
    break;
  default:
    node_local._4_4_ = 0;
  }
  return node_local._4_4_;
}

Assistant:

uint TY_(nodeHeaderLevel)( Node* node )
{
    TidyTagId tid = TagId( node  );
    switch ( tid )
    {
    case TidyTag_H1:
        return 1;
    case TidyTag_H2:
        return 2;
    case TidyTag_H3:
        return 3;
    case TidyTag_H4:
        return 4;
    case TidyTag_H5:
        return 5;
    case TidyTag_H6:
        return 6;
    default:
    {
        /* fall through */
    }
    }
    return 0;
}